

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_euler_rotation(REF_DBL phi,REF_DBL theta,REF_DBL psi,REF_DBL *rotation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_DBL *rotation_local;
  REF_DBL psi_local;
  REF_DBL theta_local;
  REF_DBL phi_local;
  
  dVar1 = cos(psi);
  dVar2 = cos(phi);
  dVar3 = cos(theta);
  dVar4 = sin(phi);
  dVar5 = sin(psi);
  *rotation = dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  dVar1 = cos(psi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = cos(phi);
  dVar5 = sin(psi);
  rotation[3] = dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  dVar1 = sin(psi);
  dVar2 = sin(theta);
  rotation[6] = dVar1 * dVar2;
  dVar1 = sin(psi);
  dVar2 = cos(phi);
  dVar3 = cos(theta);
  dVar4 = sin(phi);
  dVar5 = cos(psi);
  rotation[1] = -dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  dVar1 = sin(psi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = cos(phi);
  dVar5 = cos(psi);
  rotation[4] = -dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  dVar1 = cos(psi);
  dVar2 = sin(theta);
  rotation[7] = dVar1 * dVar2;
  dVar1 = sin(theta);
  dVar2 = sin(phi);
  rotation[2] = dVar1 * dVar2;
  dVar1 = sin(theta);
  dVar2 = cos(phi);
  rotation[5] = -dVar1 * dVar2;
  dVar1 = cos(theta);
  rotation[8] = dVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_euler_rotation(REF_DBL phi, REF_DBL theta,
                                             REF_DBL psi, REF_DBL *rotation) {
  /* listed column first */
  rotation[0] = cos(psi) * cos(phi) - cos(theta) * sin(phi) * sin(psi);
  rotation[3] = cos(psi) * sin(phi) + cos(theta) * cos(phi) * sin(psi);
  rotation[6] = sin(psi) * sin(theta);
  rotation[1] = -sin(psi) * cos(phi) - cos(theta) * sin(phi) * cos(psi);
  rotation[4] = -sin(psi) * sin(phi) + cos(theta) * cos(phi) * cos(psi);
  rotation[7] = cos(psi) * sin(theta);
  rotation[2] = sin(theta) * sin(phi);
  rotation[5] = -sin(theta) * cos(phi);
  rotation[8] = cos(theta);
  return REF_SUCCESS;
}